

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O3

void __thiscall wabt::anon_unknown_19::BinaryReader::PrintError(BinaryReader *this,char *format,...)

{
  BinaryReaderDelegate *pBVar1;
  _func_int *p_Var2;
  Offset OVar3;
  long lVar4;
  int iVar5;
  char *pcVar6;
  size_t __maxlen;
  uint uVar7;
  char *__s;
  undefined8 uStack_1f0;
  char local_1e8 [8];
  char fixed_buf [128];
  undefined8 local_b8;
  va_list args;
  string local_78;
  string_view local_58;
  undefined8 local_48;
  va_list args_copy;
  
  uVar7 = 1;
  if (this->reading_custom_section_ == true) {
    uVar7 = (uint)this->options_->fail_on_custom_section_error;
  }
  local_b8 = 0x3000000010;
  args[0]._0_8_ = &stack0x00000008;
  args[0].overflow_arg_area = fixed_buf + 0x78;
  local_48 = 0x3000000010;
  __s = local_1e8;
  uStack_1f0 = 0xf29eb8;
  args_copy[0]._0_8_ = args[0]._0_8_;
  args_copy[0].overflow_arg_area = args[0].overflow_arg_area;
  iVar5 = vsnprintf(__s,0x80,format,&local_b8);
  __maxlen = (long)iVar5 + 1;
  if (0x80 < __maxlen) {
    lVar4 = -((long)iVar5 + 0x10U & 0xfffffffffffffff0);
    __s = local_1e8 + lVar4;
    *(undefined8 *)((long)&uStack_1f0 + lVar4) = 0xf29ee7;
    vsnprintf(__s,__maxlen,format,&local_48);
  }
  __s[-8] = -1;
  __s[-7] = -0x62;
  __s[-6] = -0xe;
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  local_58.size_ = strlen(__s);
  args[0].reg_save_area._0_4_ = uVar7;
  local_58.data_ = __s;
  __s[-8] = '\x1a';
  __s[-7] = -0x61;
  __s[-6] = -0xe;
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  string_view::to_string_abi_cxx11_(&local_78,&local_58);
  pBVar1 = this->delegate_;
  p_Var2 = pBVar1->_vptr_BinaryReaderDelegate[2];
  __s[-8] = '+';
  __s[-7] = -0x61;
  __s[-6] = -0xe;
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  iVar5 = (*p_Var2)(pBVar1,&args[0].reg_save_area);
  if ((char)iVar5 == '\0') {
    OVar3 = (this->state_).offset;
    pcVar6 = "error";
    if (uVar7 == 0) {
      pcVar6 = "warning";
    }
    __s[-8] = -0x7c;
    __s[-7] = -0x61;
    __s[-6] = -0xe;
    __s[-5] = '\0';
    __s[-4] = '\0';
    __s[-3] = '\0';
    __s[-2] = '\0';
    __s[-1] = '\0';
    fprintf(_stderr,"%07zx: %s: %s\n",OVar3,pcVar6,__s);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    __s[-8] = 'A';
    __s[-7] = -0x61;
    __s[-6] = -0xe;
    __s[-5] = '\0';
    __s[-4] = '\0';
    __s[-3] = '\0';
    __s[-2] = '\0';
    __s[-1] = '\0';
    operator_delete(local_78._M_dataplus._M_p);
  }
  return;
}

Assistant:

BinaryReader::PrintError(const char* format,
                                                       ...) {
  ErrorLevel error_level =
      reading_custom_section_ && !options_.fail_on_custom_section_error
          ? ErrorLevel::Warning
          : ErrorLevel::Error;

  WABT_SNPRINTF_ALLOCA(buffer, length, format);
  Error error(error_level, Location(state_.offset), buffer);
  bool handled = delegate_->OnError(error);

  if (!handled) {
    // Not great to just print, but we don't want to eat the error either.
    fprintf(stderr, "%07" PRIzx ": %s: %s\n", state_.offset,
            GetErrorLevelName(error_level), buffer);
  }
}